

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::UninterpretedOption::_InternalSerialize
          (UninterpretedOption *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *psVar2;
  double dVar3;
  void *pvVar4;
  bool bVar5;
  Type *this_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int index;
  uint8 *puVar10;
  uint8 *puVar11;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->name_).super_RepeatedPtrFieldBase,index);
      *target = '\x12';
      uVar8 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar5 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar5);
          *puVar11 = (uint8)uVar9;
        }
      }
      target = UninterpretedOption_NamePart::_InternalSerialize(this_00,puVar10,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    psVar2 = (this->identifier_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.identifier_value");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(this->identifier_value_).ptr_,target);
  }
  if ((uVar8 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->positive_int_value_;
    *target = ' ';
    if (uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)(uVar6 >> 7);
        target = target + 3;
      }
      else {
        uVar6 = uVar6 >> 7;
        target = target + 3;
        do {
          puVar10 = target;
          puVar10[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar10 + 1;
          bVar5 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar5);
        *puVar10 = (uint8)uVar7;
      }
    }
  }
  if ((uVar8 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->negative_int_value_;
    *target = '(';
    if (uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)(uVar6 >> 7);
        target = target + 3;
      }
      else {
        uVar6 = uVar6 >> 7;
        target = target + 3;
        do {
          puVar10 = target;
          puVar10[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar10 + 1;
          bVar5 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar5);
        *puVar10 = (uint8)uVar7;
      }
    }
  }
  if ((uVar8 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    dVar3 = this->double_value_;
    *target = '1';
    *(double *)(target + 1) = dVar3;
    target = target + 9;
  }
  if ((uVar8 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,7,(this->string_value_).ptr_,target);
  }
  if ((uVar8 & 4) != 0) {
    psVar2 = (this->aggregate_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.aggregate_value");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,8,(this->aggregate_value_).ptr_,target);
  }
  pvVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar10 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8),target,stream
                        );
    return puVar10;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* UninterpretedOption::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_name_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_name(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_identifier_value().data(), static_cast<int>(this->_internal_identifier_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(4, this->_internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(5, this->_internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(6, this->_internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        7, this->_internal_string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_aggregate_value().data(), static_cast<int>(this->_internal_aggregate_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_aggregate_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}